

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::PastFunc::checkArguments
          (PastFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  ulong uVar2;
  bool bVar3;
  optional<int> oVar4;
  Type *pTVar5;
  ulong uVar6;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,4);
  if (bVar3) {
    if ((args->_M_extent)._M_extent_value == 0) {
      bVar3 = false;
    }
    else {
      uVar6 = 0;
      do {
        AssertionExpr::checkSampledValueExpr
                  (args->_M_ptr[uVar6],context,false,(DiagCode)0x22000b,(DiagCode)0x23000b);
        uVar2 = (args->_M_extent)._M_extent_value;
        if (1 < uVar6) break;
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar2);
      bVar3 = 1 < uVar2;
    }
    if ((bVar3) && (args->_M_ptr[1]->kind != EmptyArgument)) {
      oVar4 = ASTContext::evalInteger(context,args->_M_ptr[1],(bitmask<slang::ast::EvalFlags>)0x0);
      if (oVar4.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_payload < 1 &&
          ((ulong)oVar4.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
        ASTContext::addDiag(context,(DiagCode)0x1d000b,args->_M_ptr[1]->sourceRange);
      }
    }
    if ((2 < (args->_M_extent)._M_extent_value) && (args->_M_ptr[2]->kind != EmptyArgument)) {
      bVar3 = ASTContext::requireBooleanConvertible(context,args->_M_ptr[2]);
      if (!bVar3) goto LAB_003f45ea;
    }
    if ((3 < (args->_M_extent)._M_extent_value) && (args->_M_ptr[3]->kind != ClockingEvent)) {
      pTVar5 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[3]);
      return pTVar5;
    }
    pTVar5 = ((*args->_M_ptr)->type).ptr;
  }
  else {
LAB_003f45ea:
    pTVar5 = pCVar1->errorType;
  }
  return pTVar5;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 4))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size() && i < 3; i++) {
            AssertionExpr::checkSampledValueExpr(*args[i], context, false,
                                                 diag::SampledValueLocalVar,
                                                 diag::SampledValueMatched);
        }

        if (args.size() > 1 && args[1]->kind != ExpressionKind::EmptyArgument) {
            auto numTicks = context.evalInteger(*args[1]);
            if (numTicks && *numTicks < 1)
                context.addDiag(diag::PastNumTicksInvalid, args[1]->sourceRange);
        }

        if (args.size() > 2 && args[2]->kind != ExpressionKind::EmptyArgument) {
            if (!context.requireBooleanConvertible(*args[2]))
                return comp.getErrorType();
        }

        if (args.size() > 3 && args[3]->kind != ExpressionKind::ClockingEvent)
            return badArg(context, *args[3]);

        return *args[0]->type;
    }